

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O0

bool rtf_ends_with(string *a,string *b)

{
  ulong uVar1;
  ulong uVar2;
  difference_type dVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  string *local_20;
  string *b_local;
  string *a_local;
  
  local_20 = b;
  b_local = a;
  uVar1 = std::__cxx11::string::size();
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < uVar1) {
    a_local._7_1_ = false;
  }
  else {
    local_38._M_current = (char *)std::__cxx11::string::begin();
    dVar3 = std::__cxx11::string::size();
    local_30 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_38,dVar3);
    dVar3 = std::__cxx11::string::size();
    local_28 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator-(&local_30,dVar3);
    __last1._M_current = (char *)std::__cxx11::string::end();
    __first2._M_current = (char *)std::__cxx11::string::begin();
    a_local._7_1_ =
         std::
         equal<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                   (local_28,__last1,__first2);
  }
  return a_local._7_1_;
}

Assistant:

bool rtf_ends_with(const string& a, const string& b)
{
    if (b.size() > a.size()) return false;
    return std::equal(a.begin() + a.size() - b.size(), a.end(), b.begin());
}